

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,ArrayPtr<const_char> *params_4,StringTree *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,
          ArrayPtr<const_char> *params_8,ArrayPtr<const_char> *params_9,
          ArrayPtr<const_char> *params_10)

{
  size_t sVar1;
  ArrayPtr<const_char> *pAVar2;
  StringTree *pSVar3;
  char *pos;
  ArrayPtr<const_char> *rest;
  ArrayPtr<const_char> *rest_1;
  ArrayPtr<const_char> *rest_2;
  ArrayPtr<const_char> *rest_3;
  ArrayPtr<const_char> *rest_5;
  ArrayPtr<const_char> *rest_6;
  ArrayPtr<const_char> *rest_7;
  ArrayPtr<const_char> *rest_8;
  ArrayPtr<const_char> *rest_9;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  size_t local_1e0;
  size_t local_1d8;
  size_t local_1d0;
  size_t local_1c8;
  size_t local_1c0;
  size_t local_1b8;
  size_t local_1b0;
  size_t local_1a8;
  size_t local_1a0;
  size_t local_198;
  size_t local_190;
  _ *local_188;
  undefined8 local_180;
  Array<kj::StringTree::Branch> local_178;
  size_t local_160;
  size_t local_158;
  size_t local_150;
  size_t local_148;
  size_t local_140;
  size_t local_138;
  size_t local_130;
  size_t local_128;
  size_t local_120;
  size_t local_118;
  size_t local_110;
  _ *local_108;
  undefined8 local_100;
  String local_f8;
  size_t local_d0;
  size_t local_c8;
  size_t local_c0;
  size_t local_b8;
  size_t local_b0;
  size_t local_a8;
  size_t local_a0;
  size_t local_98;
  size_t local_90;
  size_t local_88;
  size_t local_80;
  _ *local_78;
  undefined8 local_70;
  undefined1 local_61;
  ArrayPtr<const_char> *local_60;
  ArrayPtr<const_char> *params_local_4;
  ArrayPtr<const_char> *params_local_3;
  ArrayPtr<const_char> *params_local_2;
  ArrayPtr<const_char> *params_local_1;
  ArrayPtr<const_char> *params_local;
  StringTree *result;
  
  local_61 = 0;
  local_60 = params_3;
  params_local_4 = params_2;
  params_local_3 = params_1;
  params_local_2 = params;
  params_local_1 = (ArrayPtr<const_char> *)this;
  params_local = (ArrayPtr<const_char> *)__return_storage_ptr__;
  StringTree(__return_storage_ptr__);
  local_d0 = ArrayPtr<const_char>::size(params_local_1);
  local_c8 = ArrayPtr<const_char>::size(params_local_2);
  local_c0 = ArrayPtr<const_char>::size(params_local_3);
  local_b8 = ArrayPtr<const_char>::size(params_local_4);
  local_b0 = ArrayPtr<const_char>::size(local_60);
  local_a8 = size((StringTree *)params_4);
  local_a0 = ArrayPtr<const_char>::size((ArrayPtr<const_char> *)params_5);
  local_98 = ArrayPtr<const_char>::size(params_6);
  local_90 = ArrayPtr<const_char>::size(params_7);
  local_88 = ArrayPtr<const_char>::size(params_8);
  local_80 = ArrayPtr<const_char>::size(params_9);
  local_78 = (_ *)&local_d0;
  local_70 = 0xb;
  nums._M_len = extraout_RDX;
  nums._M_array = (iterator)0xb;
  sVar1 = _::sum(local_78,nums);
  __return_storage_ptr__->size_ = sVar1;
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_1);
  local_160 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_2);
  local_158 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_3);
  local_150 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_4);
  local_148 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(local_60);
  local_140 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_4);
  local_138 = flatSize(pSVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_5);
  local_130 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_6);
  local_128 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_7);
  local_120 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_8);
  local_118 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_9);
  local_110 = flatSize<kj::ArrayPtr<char_const>>(pAVar2);
  local_108 = (_ *)&local_160;
  local_100 = 0xb;
  nums_00._M_len = extraout_RDX_00;
  nums_00._M_array = (iterator)0xb;
  sVar1 = _::sum(local_108,nums_00);
  heapString(&local_f8,sVar1);
  String::operator=(&__return_storage_ptr__->text,&local_f8);
  String::~String(&local_f8);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_1);
  local_1e0 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_2);
  local_1d8 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_3);
  local_1d0 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_4);
  local_1c8 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(local_60);
  local_1c0 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_4);
  local_1b8 = branchCount(pSVar3);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_5);
  local_1b0 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_6);
  local_1a8 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_7);
  local_1a0 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_8);
  local_198 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_9);
  local_190 = branchCount<kj::ArrayPtr<char_const>>(pAVar2);
  local_188 = (_ *)&local_1e0;
  local_180 = 0xb;
  nums_01._M_len = extraout_RDX_01;
  nums_01._M_array = (iterator)0xb;
  sVar1 = _::sum(local_188,nums_01);
  heapArray<kj::StringTree::Branch>(&local_178,sVar1);
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_178);
  Array<kj::StringTree::Branch>::~Array(&local_178);
  pos = String::begin(&__return_storage_ptr__->text);
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params_local_1);
  rest = fwd<kj::ArrayPtr<char_const>>(params_local_2);
  rest_1 = fwd<kj::ArrayPtr<char_const>>(params_local_3);
  rest_2 = fwd<kj::ArrayPtr<char_const>>(params_local_4);
  rest_3 = fwd<kj::ArrayPtr<char_const>>(local_60);
  pSVar3 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)params_4);
  rest_5 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)params_5);
  rest_6 = fwd<kj::ArrayPtr<char_const>>(params_6);
  rest_7 = fwd<kj::ArrayPtr<char_const>>(params_7);
  rest_8 = fwd<kj::ArrayPtr<char_const>>(params_8);
  rest_9 = fwd<kj::ArrayPtr<char_const>>(params_9);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,pAVar2,rest,rest_1,rest_2,rest_3,pSVar3,rest_5,rest_6,
             rest_7,rest_8,rest_9);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}